

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlTextReaderPtr xmlReaderForFile(char *filename,char *encoding,int options)

{
  int iVar1;
  xmlTextReaderPtr reader;
  
  reader = xmlNewTextReaderFilename(filename);
  if (reader != (xmlTextReaderPtr)0x0) {
    iVar1 = xmlTextReaderSetup(reader,(xmlParserInputBufferPtr)0x0,(char *)0x0,encoding,options);
    if (-1 < iVar1) {
      return reader;
    }
    xmlFreeTextReader(reader);
  }
  return (xmlTextReaderPtr)0x0;
}

Assistant:

xmlTextReaderPtr
xmlReaderForFile(const char *filename, const char *encoding, int options)
{
    xmlTextReaderPtr reader;

    reader = xmlNewTextReaderFilename(filename);
    if (reader == NULL)
        return (NULL);
    if (xmlTextReaderSetup(reader, NULL, NULL, encoding, options) < 0) {
        xmlFreeTextReader(reader);
        return (NULL);
    }
    return (reader);
}